

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorTextInstancer::InstanceDecorator
          (DecoratorTextInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *param_3)

{
  Vector2Numeric in_align;
  Property *pPVar1;
  Property *this_00;
  Property *pPVar2;
  reference ppPVar3;
  ulong uVar4;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Property *extraout_RDX_00;
  Property *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Vector2Numeric VVar6;
  SharedPtr<Decorator> SVar7;
  Array<const_Property_*,_2> p_position;
  String local_f8;
  undefined1 local_d8 [8];
  SharedPtr<Rml::DecoratorText> decorator;
  Vector2Numeric align;
  Colourb color;
  bool inherit_color;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  String text;
  Array<const_Property_*,_2> p_align;
  Property *p_color;
  Property *p_text;
  DecoratorInstancerInterface *param_3_local;
  PropertyDictionary *properties_local;
  String *param_1_local;
  DecoratorTextInstancer *this_local;
  
  pPVar1 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[8]);
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[9]);
  text.field_2._8_8_ =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[10]);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[0xb]);
  if ((pPVar1 != (Property *)0x0) && (this_00 != (Property *)0x0)) {
    ppPVar3 = ::std::array<const_Rml::Property_*,_2UL>::operator[]
                        ((array<const_Rml::Property_*,_2UL> *)((long)&text.field_2 + 8),0);
    if (*ppPVar3 != (value_type)0x0) {
      ppPVar3 = ::std::array<const_Rml::Property_*,_2UL>::operator[]
                          ((array<const_Rml::Property_*,_2UL> *)((long)&text.field_2 + 8),1);
      if (*ppPVar3 != (value_type)0x0) {
        Property::Get<std::__cxx11::string>(&local_90,pPVar1);
        StringUtilities::DecodeRml((String *)local_70,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        uVar4 = ::std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          align.y.unit._3_1_ = this_00->unit == KEYWORD;
          if (this_00->unit == COLOUR) {
            align.y._3_4_ = Property::Get<Rml::Colour<unsigned_char,255,false>>(this_00);
            pPVar1 = extraout_RDX_00;
          }
          else {
            Colour<unsigned_char,_255,_false>::Colour
                      ((Colour<unsigned_char,_255,_false> *)((long)&align.y.number + 3),'\0',0xff);
            pPVar1 = extraout_RDX_01;
          }
          decorator.super___shared_ptr<Rml::DecoratorText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)text.field_2._8_8_;
          p_position._M_elems[1] = pPVar1;
          p_position._M_elems[0] = pPVar2;
          VVar6 = ComputePosition((Rml *)text.field_2._8_8_,p_position);
          align.x = VVar6.y;
          MakeShared<Rml::DecoratorText>();
          this_01 = ::std::
                    __shared_ptr_access<Rml::DecoratorText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Rml::DecoratorText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_d8);
          ::std::__cxx11::string::string((string *)&local_f8,(string *)local_70);
          in_align.y = align.x;
          in_align.x = VVar6.x;
          DecoratorText::Initialise
                    (this_01,&local_f8,(bool)(align.y.unit._3_1_ & FILTER >> 0x18),
                     (Colourb)align.y._3_4_,in_align);
          ::std::__cxx11::string::~string((string *)&local_f8);
          ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorText,void>
                    ((shared_ptr<Rml::Decorator> *)this,(shared_ptr<Rml::DecoratorText> *)local_d8);
          ::std::shared_ptr<Rml::DecoratorText>::~shared_ptr
                    ((shared_ptr<Rml::DecoratorText> *)local_d8);
        }
        else {
          ::std::shared_ptr<Rml::Decorator>::shared_ptr
                    ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
        }
        ::std::__cxx11::string::~string((string *)local_70);
        _Var5._M_pi = extraout_RDX_02;
        goto LAB_00539d52;
      }
    }
  }
  ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
  _Var5._M_pi = extraout_RDX;
LAB_00539d52:
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTextInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& /*instancer_interface*/)
{
	const Property* p_text = properties.GetProperty(ids.text);
	const Property* p_color = properties.GetProperty(ids.color);
	Array<const Property*, 2> p_align = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};
	if (!p_text || !p_color || !p_align[0] || !p_align[1])
		return nullptr;

	String text = StringUtilities::DecodeRml(p_text->Get<String>());
	if (text.empty())
		return nullptr;

	const bool inherit_color = (p_color->unit == Unit::KEYWORD);
	const Colourb color = (p_color->unit == Unit::COLOUR ? p_color->Get<Colourb>() : Colourb{});
	const Vector2Numeric align = ComputePosition(p_align);

	auto decorator = MakeShared<DecoratorText>();
	decorator->Initialise(std::move(text), inherit_color, color, align);
	return decorator;
}